

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall google::protobuf::Descriptor::CopyTo(Descriptor *this,DescriptorProto *proto)

{
  int iVar1;
  FieldDescriptor *pFVar2;
  FieldDescriptorProto *pFVar3;
  OneofDescriptor *this_00;
  OneofDescriptorProto *proto_00;
  Descriptor *this_01;
  DescriptorProto *proto_01;
  EnumDescriptor *this_02;
  EnumDescriptorProto *proto_02;
  ExtensionRange *this_03;
  DescriptorProto_ExtensionRange *proto_03;
  undefined4 local_30;
  undefined4 local_2c;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  DescriptorProto *proto_local;
  Descriptor *this_local;
  
  CopyHeadingTo(this,proto);
  i_2 = 0;
  while( true ) {
    iVar1 = field_count(this);
    if (iVar1 <= i_2) break;
    pFVar2 = field(this,i_2);
    pFVar3 = DescriptorProto::add_field(proto);
    FieldDescriptor::CopyTo(pFVar2,pFVar3);
    i_2 = i_2 + 1;
  }
  i_3 = 0;
  while( true ) {
    iVar1 = oneof_decl_count(this);
    if (iVar1 <= i_3) break;
    this_00 = oneof_decl(this,i_3);
    proto_00 = DescriptorProto::add_oneof_decl(proto);
    OneofDescriptor::CopyTo(this_00,proto_00);
    i_3 = i_3 + 1;
  }
  i_4 = 0;
  while( true ) {
    iVar1 = nested_type_count(this);
    if (iVar1 <= i_4) break;
    this_01 = nested_type(this,i_4);
    proto_01 = DescriptorProto::add_nested_type(proto);
    CopyTo(this_01,proto_01);
    i_4 = i_4 + 1;
  }
  i_5 = 0;
  while( true ) {
    iVar1 = enum_type_count(this);
    if (iVar1 <= i_5) break;
    this_02 = enum_type(this,i_5);
    proto_02 = DescriptorProto::add_enum_type(proto);
    EnumDescriptor::CopyTo(this_02,proto_02);
    i_5 = i_5 + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar1 = extension_range_count(this);
    if (iVar1 <= local_2c) break;
    this_03 = extension_range(this,local_2c);
    proto_03 = DescriptorProto::add_extension_range(proto);
    ExtensionRange::CopyTo(this_03,proto_03);
    local_2c = local_2c + 1;
  }
  local_30 = 0;
  while( true ) {
    iVar1 = extension_count(this);
    if (iVar1 <= local_30) break;
    pFVar2 = extension(this,local_30);
    pFVar3 = DescriptorProto::add_extension(proto);
    FieldDescriptor::CopyTo(pFVar2,pFVar3);
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

void Descriptor::CopyTo(DescriptorProto* proto) const {
  CopyHeadingTo(proto);

  for (int i = 0; i < field_count(); i++) {
    field(i)->CopyTo(proto->add_field());
  }
  for (int i = 0; i < oneof_decl_count(); i++) {
    oneof_decl(i)->CopyTo(proto->add_oneof_decl());
  }
  for (int i = 0; i < nested_type_count(); i++) {
    nested_type(i)->CopyTo(proto->add_nested_type());
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->CopyTo(proto->add_enum_type());
  }
  for (int i = 0; i < extension_range_count(); i++) {
    extension_range(i)->CopyTo(proto->add_extension_range());
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyTo(proto->add_extension());
  }
}